

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CppPrinter.cpp
# Opt level: O3

void __thiscall hdc::CppPrinter::generatePrototype(CppPrinter *this,Def *def)

{
  undefined1 *puVar1;
  Type *pTVar2;
  ostream *poVar3;
  string local_40;
  
  pTVar2 = Def::getReturnType(def);
  (**(pTVar2->super_ASTNode)._vptr_ASTNode)(pTVar2,this);
  puVar1 = &this->field_0x20;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)puVar1," ",1);
  Def::getUniqueCppName_abi_cxx11_(&local_40,def);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)puVar1,local_40._M_dataplus._M_p,local_40._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"(",1);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p);
  }
  generateDefParameters(this,def);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)puVar1,");\n",3);
  return;
}

Assistant:

void CppPrinter::generatePrototype(Def* def) {
    def->getReturnType()->accept(this);
    output << " " << def->getUniqueCppName() << "(";

    generateDefParameters(def);
    output << ");\n";
}